

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  LogMessage *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  LogMessage local_40;
  
  if (*(int *)((long)&(in_RDI->message_).field_2 + 8) != 0) {
    in_stack_ffffffffffffff90 = &local_40;
    internal::LogMessage::LogMessage
              (in_RDI,(LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff90,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x5cd615);
  }
  *(undefined4 *)((long)&(in_RDI->message_).field_2 + 4) = 0;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::reset
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_ffffffffffffff90,
             (nullptr_t)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  return;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  GOOGLE_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}